

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setPricer
          (SPxSolverBase<double> *this,SPxPricer<double> *x,bool destroy)

{
  SPxPricer<double> *pSVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pSVar1 = this->thepricer;
  if (this->freePricer == true) {
    if (pSVar1 != (SPxPricer<double> *)0x0) {
      (*pSVar1->_vptr_SPxPricer[0x15])();
    }
    this->thepricer = (SPxPricer<double> *)0x0;
    pSVar1 = (SPxPricer<double> *)0x0;
  }
  if (pSVar1 != x && x != (SPxPricer<double> *)0x0) {
    setPricing(this,FULL);
    if (this->initialized == true) {
      (*x->_vptr_SPxPricer[1])(x,this);
    }
    else {
      (*x->_vptr_SPxPricer[2])(x);
    }
  }
  pSVar1 = this->thepricer;
  if (pSVar1 != x && pSVar1 != (SPxPricer<double> *)0x0) {
    (*pSVar1->_vptr_SPxPricer[2])();
  }
  this->thepricer = x;
  if (x != (SPxPricer<double> *)0x0) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &(this->super_SPxLPBase<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    (*x->_vptr_SPxPricer[6])(x,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  this->freePricer = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setPricer(SPxPricer<R>* x, const bool destroy)
{

   assert(!freePricer || thepricer != nullptr);

   if(freePricer)
   {
      delete thepricer;
      thepricer = nullptr;
   }

   if(x != nullptr && x != thepricer)
   {
      setPricing(FULL);

      if(isInitialized())
         x->load(this);
      else
         x->clear();
   }

   if(thepricer && thepricer != x)
      thepricer->clear();

   thepricer = x;

   if(thepricer != nullptr)
      thepricer->setTolerances(this->tolerances());

   freePricer = destroy;
}